

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O2

void __thiscall Gillespie::Iterate(Gillespie *this)

{
  double dVar1;
  pointer psVar2;
  pointer pdVar3;
  int index;
  SpeciesTracker *pSVar4;
  underflow_error *this_00;
  code *pcVar5;
  long lVar6;
  undefined *puVar7;
  ulong uVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  __shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->initialized_ == false) {
    Initialize(this);
  }
  if (this->alpha_sum_ <= 0.0) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              ((runtime_error *)this_00,
               "Gillespie: Propensity of system is 0. No reactions will execute.");
    puVar7 = &std::runtime_error::typeinfo;
    pcVar5 = std::runtime_error::~runtime_error;
LAB_0012721d:
    __cxa_throw(this_00,puVar7,pcVar5);
  }
  Random::random();
  dVar1 = this->alpha_sum_;
  dVar9 = log(1.0 / extraout_XMM0_Qa);
  dVar9 = dVar9 * (1.0 / dVar1);
  if (0x3fe < (uint)((ulong)((long)ABS(dVar9) + -0x10000000000000) >> 0x35)) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::underflow_error::underflow_error(this_00,"Underflow error.");
    puVar7 = &std::underflow_error::typeinfo;
    pcVar5 = std::underflow_error::~underflow_error;
    goto LAB_0012721d;
  }
  this->time_ = dVar9 + this->time_;
  index = Random::WeightedChoiceIndex<std::shared_ptr<Reaction>>
                    (&this->reactions_,&this->alpha_list_);
  (**(code **)((long)((this->reactions_).
                      super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[index].
                      super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_Reaction + 8))();
  if (((this->reactions_).
       super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
       _M_impl.super__Vector_impl_data._M_start[index].
       super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tRNA_reaction_ == false) {
    pSVar4 = SpeciesTracker::Instance();
    if (pSVar4->force_update_all_ != true) {
      std::__shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 &(this->reactions_).
                  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[index].
                  super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>);
      UpdatePropensity(this,(Ptr *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      goto LAB_001271a2;
    }
  }
  lVar6 = 0;
  for (uVar8 = 0;
      psVar2 = (this->reactions_).
               super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->reactions_).
                            super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar8 = uVar8 + 1) {
    std::__shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(psVar2->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar6));
    (**(local_40._M_ptr)->_vptr_Reaction)();
    pdVar3 = (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[uVar8] = pdVar3[uVar8] + extraout_XMM0_Qa_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    this->alpha_sum_ = extraout_XMM0_Qa_00 + this->alpha_sum_;
    lVar6 = lVar6 + 0x10;
  }
  pSVar4 = SpeciesTracker::Instance();
  pSVar4->force_update_all_ = false;
LAB_001271a2:
  if (((this->reactions_).
       super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
       _M_impl.super__Vector_impl_data._M_start[index].
       super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->remove_ == true) {
    DeleteReaction(this,index);
  }
  this->iteration_ = this->iteration_ + 1;
  return;
}

Assistant:

void Gillespie::Iterate() {
  // Make sure propensities have been initialized
  // std::cout << "begin iteration" << std::endl;
  if (initialized_ == false) {
    Initialize();
  }

  // Basic sanity checks
  if (alpha_sum_ <= 0) {
    throw std::runtime_error(
        "Gillespie: Propensity of system is 0. No reactions will execute.");
  }
  double random_num = Random::random();
  // Calculate tau, i.e. time until next reaction
  double tau = (1.0 / alpha_sum_) * std::log(1.0 / random_num);
  if (!std::isnormal(tau)) {
    throw std::underflow_error("Underflow error.");
  }
  time_ += tau;
  // Randomly select next reaction to execute, weighted by propensities
  auto next_reaction = Random::WeightedChoiceIndex(reactions_, alpha_list_);
  reactions_[next_reaction]->Execute();
  // std::cout << std::to_string(alpha_list_[next_reaction]) << std::endl;
  // if (!SpeciesTracker::Instance().codon_map().empty()) {
  if (reactions_[next_reaction]->is_tRNA() || SpeciesTracker::Instance().check_force_update()) {
    for (int i = 0; i < reactions_.size(); i++) {
      double alpha_diff = IndexUpdatePropensity(reactions_[i], i);
      alpha_sum_ += alpha_diff;
    }
    SpeciesTracker::Instance().unflag_force_update();
  } else {
    UpdatePropensity(reactions_[next_reaction]);
  }
  if (reactions_[next_reaction]->remove() == true) {
    // std::cout << std::to_string(alpha_list_[next_reaction]) << std::endl;
    DeleteReaction(next_reaction);
  }
  iteration_++;
}